

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

bool __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::IsValid
          (RefCntWeakPtr<Diligent::IRenderDevice> *this)

{
  if ((this->m_pObject != (IRenderDevice *)0x0) && (this->m_pRefCounters != (RefCountersImpl *)0x0))
  {
    return 0 < (this->m_pRefCounters->m_NumStrongReferences).super___atomic_base<int>._M_i;
  }
  return false;
}

Assistant:

bool IsValid() const noexcept
    {
        return m_pObject != nullptr && m_pRefCounters != nullptr && m_pRefCounters->GetNumStrongRefs() > 0;
    }